

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allergen-assessment.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  variant_alternative_t<1UL,_variant<int,_basic_ifstream<char>_>_> *file_00;
  _Rb_tree_node_base *p_Var2;
  ostream *poVar3;
  variant_alternative_t<0UL,_variant<int,_basic_ifstream<char>_>_> *pvVar4;
  int iVar5;
  iter_difference_t<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char>_>_> __n;
  unsigned_long uVar6;
  pointer puVar7;
  foods_t foods;
  vector<unsigned_long,_std::allocator<unsigned_long>_> occurence;
  string a2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tokens;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  allergen_food;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  safe;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allergens;
  variant<int,_std::basic_ifstream<char,_std::char_traits<char>_>_> file;
  
  if (argc == 2) {
    get_input(&file,2,argv);
    if (file.super__Variant_base<int,_std::basic_ifstream<char,_std::char_traits<char>_>_>.
        super__Move_assign_alias<int,_std::basic_ifstream<char>_>.
        super__Copy_assign_alias<int,_std::basic_ifstream<char>_>.
        super__Move_ctor_alias<int,_std::basic_ifstream<char>_>.
        super__Copy_ctor_alias<int,_std::basic_ifstream<char>_>.
        super__Variant_storage_alias<int,_std::basic_ifstream<char>_>._M_index == '\0') {
      pvVar4 = std::get<0ul,int,std::ifstream>(&file);
      iVar5 = *pvVar4;
    }
    else {
      file_00 = std::get<1ul,int,std::ifstream>(&file);
      tokenize_abi_cxx11_<std::ifstream>(&tokens,file_00);
      read_foods<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                (&foods,&tokens);
      all_allergens_abi_cxx11_(&allergens,&foods);
      safe_ingredients_abi_cxx11_(&safe,&foods);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&occurence,
                 ((long)foods.
                        super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)foods.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x60,
                 (allocator_type *)&allergen_food);
      puVar7 = occurence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (; foods.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>._M_impl.
             super__Vector_impl_data._M_start !=
             foods.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>._M_impl.
             super__Vector_impl_data._M_finish;
          foods.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>._M_impl.
          super__Vector_impl_data._M_start =
               foods.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>._M_impl
               .super__Vector_impl_data._M_start + 1) {
        uVar6 = 0;
        for (p_Var2 = ((foods.
                        super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>.
                        _M_impl.super__Vector_impl_data._M_start)->ingredients)._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var2 !=
            &((foods.super__Vector_base<ingredientlist_t,_std::allocator<ingredientlist_t>_>._M_impl
               .super__Vector_impl_data._M_start)->ingredients)._M_t._M_impl.super__Rb_tree_header;
            p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
          bVar1 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::contains(&safe,(key_type *)(p_Var2 + 1));
          uVar6 = uVar6 + bVar1;
        }
        *puVar7 = uVar6;
        puVar7 = puVar7 + 1;
      }
      for (; occurence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start !=
             occurence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
          occurence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start =
               occurence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + 1) {
      }
      poVar3 = std::operator<<((ostream *)&std::cout,"Part 1: ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,"\n");
      a2._M_dataplus._M_p = (pointer)&a2.field_2;
      a2._M_string_length = 0;
      a2.field_2._M_local_buf[0] = '\0';
      solve_allergens_abi_cxx11_(&allergen_food,&foods);
      for (; (_Rb_tree_header *)allergen_food._M_t._M_impl.super__Rb_tree_header._M_header._M_left
             != &allergen_food._M_t._M_impl.super__Rb_tree_header;
          allergen_food._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               (_Base_ptr)
               std::_Rb_tree_increment
                         (allergen_food._M_t._M_impl.super__Rb_tree_header._M_header._M_left)) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&a2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (allergen_food._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 2));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&a2,',');
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back(&a2)
      ;
      poVar3 = std::operator<<((ostream *)&std::cout,"Part 2: ");
      poVar3 = std::operator<<(poVar3,(string *)&a2);
      std::operator<<(poVar3,"\n");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,(string *)&a2);
      std::operator<<(poVar3,"\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&allergen_food._M_t);
      std::__cxx11::string::~string((string *)&a2);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&occurence.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&safe._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&allergens._M_t);
      std::vector<ingredientlist_t,_std::allocator<ingredientlist_t>_>::~vector(&foods);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&tokens);
      iVar5 = 0;
    }
    std::__detail::__variant::
    _Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>::
    ~_Variant_storage((_Variant_storage<false,_int,_std::basic_ifstream<char,_std::char_traits<char>_>_>
                       *)&file);
  }
  else {
    poVar3 = std::operator<<((ostream *)&std::cout,"Usage: ");
    poVar3 = std::operator<<(poVar3,*argv);
    poVar3 = std::operator<<(poVar3," {path-to-file}");
    std::endl<char,std::char_traits<char>>(poVar3);
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

auto main(int argc, char* argv[]) -> int {
  if (argc != 2) {
    std::cout << "Usage: " << argv[0] << " {path-to-file}" << std::endl;
    return 1;
  }

  auto file = get_input(argc, argv);

  if (std::holds_alternative<int>(file))
    return std::get<int>(file);

  auto& input = std::get<std::ifstream>(file);

  auto tokens = tokenize(input);

  auto foods = read_foods(tokens);
  auto allergens = all_allergens(foods);
  auto safe = safe_ingredients(foods);

  // Part 1: count occurence of safe ingredients in all food
  auto occurence = std::vector<size_t> (foods.size());
  ranges::transform(foods, occurence.begin(), [&safe](const auto& food){
    return ranges::count_if(food.ingredients, [&safe](const auto& ingredient){
      return safe.contains(ingredient);
    });
  });
  auto a1 = std::accumulate(occurence.cbegin(), occurence.cend(), size_t{0});
  std::cout << "Part 1: " << a1 << "\n";

  // Part 2: solve the allergen-ingredient map
  std::string a2;
  auto allergen_food = solve_allergens(foods);
  ranges::for_each(allergen_food, [&](const auto& af){
    a2.append(af.second);
    a2.push_back(',');
  });
  a2.pop_back();
  std::cout << "Part 2: " << a2 << "\n";
  std::cout << a1 << "\n" << a2 << "\n";
}